

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  ucvector *puVar1;
  uint uVar2;
  uint extraout_EAX;
  uchar *puVar3;
  size_t sVar4;
  ulong uVar5;
  ulong __size;
  uchar *data;
  ulong uVar6;
  ulong uVar7;
  uchar uVar8;
  size_t sVar9;
  bool bVar10;
  ucvector compressed;
  uchar *local_78;
  size_t asStack_70 [3];
  uchar *local_58;
  uchar *local_50;
  char *local_48;
  ucvector *local_40;
  LodePNGCompressSettings *local_38;
  
  local_50 = (uchar *)textstring;
  local_40 = out;
  local_38 = zlibsettings;
  puVar3 = (uchar *)strlen(textstring);
  local_78 = (uchar *)0x0;
  asStack_70[0] = 0;
  asStack_70[1] = 0;
  uVar8 = *keyword;
  local_58 = puVar3;
  if (uVar8 == '\0') {
    uVar2 = (uint)CONCAT71((int7)((ulong)puVar3 >> 8),1);
    data = (uchar *)0x0;
    uVar7 = 0;
    sVar4 = 0;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    sVar4 = 0;
    uVar7 = 0;
    data = (uchar *)0x0;
    local_48 = keyword;
    do {
      uVar5 = uVar7 + 1;
      if (sVar4 < uVar5) {
        __size = uVar5 * 3 >> 1;
        if (sVar4 * 2 < uVar5) {
          __size = uVar5;
        }
        puVar3 = (uchar *)realloc(data,__size);
        bVar10 = puVar3 == (uchar *)0x0;
        keyword = local_48;
        if (!bVar10) {
          sVar4 = __size;
          data = puVar3;
        }
      }
      else {
        bVar10 = false;
      }
      if (!bVar10) {
        data[uVar7] = uVar8;
        uVar7 = uVar5;
      }
      uVar8 = keyword[uVar6 + 2];
      uVar6 = uVar6 + 1;
    } while (uVar8 != '\0');
    uVar2 = (uint)CONCAT71((int7)((ulong)puVar3 >> 8),0x4e < uVar6);
  }
  if ((char)uVar2 == '\0') {
    uVar6 = uVar7 + 1;
    if (sVar4 < uVar6) {
      uVar5 = uVar6 * 3 >> 1;
      if (sVar4 * 2 < uVar6) {
        uVar5 = uVar6;
      }
      puVar3 = (uchar *)realloc(data,uVar5);
      if (puVar3 == (uchar *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = false;
        sVar4 = uVar5;
        data = puVar3;
      }
    }
    else {
      bVar10 = false;
    }
    if (!bVar10) {
      data[uVar7] = '\0';
      uVar7 = uVar6;
    }
    uVar6 = uVar7 + 1;
    if (sVar4 < uVar6) {
      uVar5 = uVar6 * 3 >> 1;
      if (sVar4 * 2 < uVar6) {
        uVar5 = uVar6;
      }
      puVar3 = (uchar *)realloc(data,uVar5);
      if (puVar3 == (uchar *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = false;
        sVar4 = uVar5;
        data = puVar3;
      }
    }
    else {
      bVar10 = false;
    }
    if (!bVar10) {
      data[uVar7] = '\0';
      uVar7 = uVar6;
    }
    if (local_38->custom_zlib ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar2 = lodepng_zlib_compress(&local_78,asStack_70,local_50,(size_t)local_58,local_38);
    }
    else {
      uVar2 = (*local_38->custom_zlib)(&local_78,asStack_70,local_50,(size_t)local_58,local_38);
    }
    if (uVar2 == 0) {
      if (asStack_70[0] != 0) {
        sVar9 = 0;
        do {
          uVar8 = local_78[sVar9];
          uVar6 = uVar7 + 1;
          if (sVar4 < uVar6) {
            uVar5 = uVar6 * 3 >> 1;
            if (sVar4 * 2 < uVar6) {
              uVar5 = uVar6;
            }
            puVar3 = (uchar *)realloc(data,uVar5);
            bVar10 = puVar3 == (uchar *)0x0;
            if (!bVar10) {
              sVar4 = uVar5;
              data = puVar3;
            }
          }
          else {
            bVar10 = false;
          }
          if (!bVar10) {
            data[uVar7] = uVar8;
            uVar7 = uVar6;
          }
          sVar9 = sVar9 + 1;
        } while (sVar9 != asStack_70[0]);
      }
      puVar1 = local_40;
      uVar2 = lodepng_chunk_create(&local_40->data,&local_40->size,(uint)uVar7,"zTXt",data);
      if (uVar2 == 0) {
        puVar1->allocsize = puVar1->size;
      }
    }
    asStack_70[0] = 0;
    asStack_70[1] = 0;
    free(local_78);
    local_78 = (uchar *)0x0;
    free(data);
    uVar2 = extraout_EAX;
  }
  return uVar2;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
	LodePNGCompressSettings* zlibsettings)
{
	unsigned error = 0;
	ucvector data, compressed;
	size_t i, textsize = strlen(textstring);

	ucvector_init(&data);
	ucvector_init(&compressed);
	for (i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
	if (i < 1 || i > 79) return 89; /*error: invalid keyword size*/
	ucvector_push_back(&data, 0); /*0 termination char*/
	ucvector_push_back(&data, 0); /*compression method: 0*/

	error = zlib_compress(&compressed.data, &compressed.size,
		(unsigned char*)textstring, textsize, zlibsettings);
	if (!error)
	{
		for (i = 0; i != compressed.size; ++i) ucvector_push_back(&data, compressed.data[i]);
		error = addChunk(out, "zTXt", data.data, data.size);
	}

	ucvector_cleanup(&compressed);
	ucvector_cleanup(&data);
	return error;
}